

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpath.cpp
# Opt level: O1

void __thiscall VPath::VPathData::reserve(VPathData *this,size_t pts,size_t elms)

{
  pointer pVVar1;
  pointer pEVar2;
  ulong __n;
  pointer __n_00;
  
  pVVar1 = (this->m_points).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = ((long)(this->m_points).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)pVVar1 >> 3) + pts;
  if ((ulong)((long)(this->m_points).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage - (long)pVVar1 >> 3) < __n) {
    std::vector<VPointF,_std::allocator<VPointF>_>::reserve(&this->m_points,__n);
  }
  pEVar2 = (this->m_elements).super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>.
           _M_impl.super__Vector_impl_data._M_start;
  __n_00 = (this->m_elements).super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>.
           _M_impl.super__Vector_impl_data._M_finish + (elms - (long)pEVar2);
  if ((this->m_elements).super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage + -(long)pEVar2 < __n_00) {
    std::vector<VPath::Element,_std::allocator<VPath::Element>_>::reserve
              (&this->m_elements,(size_type)__n_00);
    return;
  }
  return;
}

Assistant:

void VPath::VPathData::reserve(size_t pts, size_t elms)
{
    if (m_points.capacity() < m_points.size() + pts)
        m_points.reserve(m_points.size() + pts);
    if (m_elements.capacity() < m_elements.size() + elms)
        m_elements.reserve(m_elements.size() + elms);
}